

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

double gamln(double *a)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_18;
  
  dVar2 = *a;
  if (dVar2 <= 0.8) {
    dVar3 = gamln1(a);
    dVar2 = log(*a);
    dVar3 = dVar3 - dVar2;
  }
  else {
    if (dVar2 <= 2.25) {
      gamln::t = dVar2 + -0.5 + -0.5;
      dVar2 = gamln1(&gamln::t);
      return dVar2;
    }
    if (10.0 <= dVar2) {
      gamln::t = (1.0 / dVar2) * (1.0 / dVar2);
      dVar4 = ((((gamln::t * -0.00165322962780713 + 0.000837308034031215) * gamln::t +
                -0.00059520293135187) * gamln::t + 0.00079365066682539) * gamln::t +
              -0.00277777777760991) * gamln::t;
      dVar2 = *a;
      dVar3 = log(dVar2);
      dVar3 = (dVar3 + -1.0) * (dVar2 + -0.5) +
              (dVar4 + 0.0833333333333333) / dVar2 + 0.418938533204673;
    }
    else {
      iVar1 = (int)(dVar2 + -1.25);
      if (iVar1 < 1) {
        local_18 = 1.0;
      }
      else {
        local_18 = 1.0;
        do {
          dVar2 = dVar2 + -1.0;
          local_18 = local_18 * dVar2;
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
      gamln::T1 = dVar2 + -1.0;
      gamln::t = dVar2;
      dVar2 = gamln1(&gamln::T1);
      dVar3 = log(local_18);
      dVar3 = dVar3 + dVar2;
    }
  }
  return dVar3;
}

Assistant:

double gamln(double *a)
/*
-----------------------------------------------------------------------
            EVALUATION OF LN(GAMMA(A)) FOR POSITIVE A
-----------------------------------------------------------------------
     WRITTEN BY ALFRED H. MORRIS
          NAVAL SURFACE WARFARE CENTER
          DAHLGREN, VIRGINIA
--------------------------
     D = 0.5*(LN(2*PI) - 1)
--------------------------
*/
{
static double c0 = .833333333333333e-01;
static double c1 = -.277777777760991e-02;
static double c2 = .793650666825390e-03;
static double c3 = -.595202931351870e-03;
static double c4 = .837308034031215e-03;
static double c5 = -.165322962780713e-02;
static double d = .418938533204673e0;
static double gamln,t,w;
static int i,n;
static double T1;
/*
     ..
     .. Executable Statements ..
*/
    if(*a > 0.8e0) goto S10;
    gamln = gamln1(a)-log(*a);
    return gamln;
S10:
    if(*a > 2.25e0) goto S20;
    t = *a-0.5e0-0.5e0;
    gamln = gamln1(&t);
    return gamln;
S20:
    if(*a >= 10.0e0) goto S40;
    n = *a-1.25e0;
    t = *a;
    w = 1.0e0;
    for(i=1; i<=n; i++) {
        t -= 1.0e0;
        w = t*w;
    }
    T1 = t-1.0e0;
    gamln = gamln1(&T1)+log(w);
    return gamln;
S40:
    t = pow(1.0e0/ *a,2.0);
    w = (((((c5*t+c4)*t+c3)*t+c2)*t+c1)*t+c0)/ *a;
    gamln = d+w+(*a-0.5e0)*(log(*a)-1.0e0);
    return gamln;
}